

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O2

void __thiscall QPauseAnimation::setDuration(QPauseAnimation *this,int msecs)

{
  QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
  *this_00;
  long lVar1;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (msecs < 0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,"QPauseAnimation::setDuration: cannot set a negative duration");
  }
  else {
    lVar1 = *(long *)(this + 8);
    this_00 = (QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
               *)(lVar1 + 0xa0);
    QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(this_00);
    if (*(int *)(lVar1 + 0xa0) != msecs) {
      (this_00->super_QPropertyData<int>).val = msecs;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
        ::notify(this_00);
        return;
      }
      goto LAB_00367b44;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00367b44:
  __stack_chk_fail();
}

Assistant:

void QPauseAnimation::setDuration(int msecs)
{
    if (msecs < 0) {
        qWarning("QPauseAnimation::setDuration: cannot set a negative duration");
        return;
    }
    Q_D(QPauseAnimation);

    d->duration.removeBindingUnlessInWrapper();
    if (msecs != d->duration.valueBypassingBindings()) {
        d->duration.setValueBypassingBindings(msecs);
        d->duration.notify();
    }
}